

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

void __thiscall
cmCTestMultiProcessHandler::CreateParallelTestCostList(cmCTestMultiProcessHandler *this)

{
  const_iterator this_00;
  const_iterator this_01;
  bool bVar1;
  pointer ppVar2;
  mapped_type *ppcVar3;
  set<int,_std::less<int>,_std::allocator<int>_> *psVar4;
  reference piVar5;
  iterator iVar6;
  iterator __last;
  iterator __first;
  iterator __last_00;
  reference piVar7;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar8;
  _Self local_218;
  _Self local_210;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_208;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_200;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_1f8;
  const_iterator j;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1c0;
  const_iterator local_1b8;
  undefined1 local_1b0 [8];
  TestList sortedCopy;
  TestComparator comp;
  TestSet *currentSet_1;
  reverse_iterator i_3;
  iterator local_170;
  const_iterator i_2;
  TestSet *dependencies;
  _Self local_148;
  const_iterator i_1;
  TestSet *currentSet;
  _Rb_tree_node_base _Stack_130;
  size_t sStack_110;
  set<int,_std::less<int>,_std::allocator<int>_> *local_108;
  TestSet *previousSet;
  undefined1 local_f8;
  _Base_ptr local_f0;
  undefined1 local_e8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c8;
  iterator local_c0;
  _Rb_tree_const_iterator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_> local_b8;
  iterator local_b0;
  _Rb_tree_const_iterator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_> local_a8;
  const_iterator i;
  TestSet *topLevel;
  TestSet local_88;
  undefined1 local_58 [8];
  list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
  priorityStack;
  TestSet alreadySortedTests;
  cmCTestMultiProcessHandler *this_local;
  
  TestSet::TestSet((TestSet *)
                   &priorityStack.
                    super__List_base<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
                    ._M_impl._M_node._M_size);
  std::__cxx11::
  list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>::
  list((list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
        *)local_58);
  local_88.super_set<int,_std::less<int>,_std::allocator<int>_>._M_t._M_impl.super__Rb_tree_header.
  _M_header._M_right = (_Base_ptr)0x0;
  local_88.super_set<int,_std::less<int>,_std::allocator<int>_>._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  local_88.super_set<int,_std::less<int>,_std::allocator<int>_>._M_t._M_impl.super__Rb_tree_header.
  _M_header._M_parent = (_Base_ptr)0x0;
  local_88.super_set<int,_std::less<int>,_std::allocator<int>_>._M_t._M_impl.super__Rb_tree_header.
  _M_header._M_left = (_Base_ptr)0x0;
  local_88.super_set<int,_std::less<int>,_std::allocator<int>_>._M_t._M_impl._0_8_ = 0;
  local_88.super_set<int,_std::less<int>,_std::allocator<int>_>._M_t._M_impl.super__Rb_tree_header.
  _M_header._M_color = _S_red;
  local_88.super_set<int,_std::less<int>,_std::allocator<int>_>._M_t._M_impl.super__Rb_tree_header.
  _M_header._4_4_ = 0;
  TestSet::TestSet(&local_88);
  std::__cxx11::
  list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>::
  push_back((list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
             *)local_58,&local_88);
  TestSet::~TestSet(&local_88);
  i._M_node = (_Base_ptr)
              std::__cxx11::
              list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
              ::back((list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
                      *)local_58);
  local_b0._M_node =
       (_Base_ptr)
       std::
       map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
       ::begin(&(this->Tests).
                super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
              );
  std::_Rb_tree_const_iterator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>::
  _Rb_tree_const_iterator(&local_a8,&local_b0);
  while( true ) {
    local_c0._M_node =
         (_Base_ptr)
         std::
         map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
         ::end(&(this->Tests).
                super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
              );
    std::_Rb_tree_const_iterator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>::
    _Rb_tree_const_iterator(&local_b8,&local_c0);
    bVar1 = std::operator!=(&local_a8,&local_b8);
    if (!bVar1) break;
    local_d0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&this->LastTestsFailed);
    local_d8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->LastTestsFailed);
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>::
             operator->(&local_a8);
    ppcVar3 = std::
              map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              ::operator[](&(this->Properties).
                            super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                           ,&ppVar2->first);
    local_c8 = std::
               find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                         (local_d0,local_d8,&(*ppcVar3)->Name);
    local_e0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->LastTestsFailed);
    bVar1 = __gnu_cxx::operator!=(&local_c8,&local_e0);
    this_01 = i;
    if (bVar1) {
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>::
               operator->(&local_a8);
      std::vector<int,_std::allocator<int>_>::push_back
                (&(this->SortedTests).super_vector<int,_std::allocator<int>_>,&ppVar2->first);
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>::
               operator->(&local_a8);
      pVar8 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)
                         &priorityStack.
                          super__List_base<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
                          ._M_impl._M_node._M_size,&ppVar2->first);
      local_f0 = (_Base_ptr)pVar8.first._M_node;
      local_e8 = pVar8.second;
    }
    else {
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>::
               operator->(&local_a8);
      pVar8 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)this_01._M_node,
                         &ppVar2->first);
      previousSet = (TestSet *)pVar8.first._M_node;
      local_f8 = pVar8.second;
    }
    std::_Rb_tree_const_iterator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>::
    operator++(&local_a8);
  }
  while( true ) {
    psVar4 = &std::__cxx11::
              list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
              ::back((list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
                      *)local_58)->super_set<int,_std::less<int>,_std::allocator<int>_>;
    bVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::empty(psVar4);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_108 = &std::__cxx11::
                 list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
                 ::back((list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
                         *)local_58)->super_set<int,_std::less<int>,_std::allocator<int>_>;
    _Stack_130._M_right = (_Base_ptr)0x0;
    sStack_110 = 0;
    _Stack_130._M_parent = (_Base_ptr)0x0;
    _Stack_130._M_left = (_Base_ptr)0x0;
    currentSet = (TestSet *)0x0;
    _Stack_130._M_color = _S_red;
    _Stack_130._4_4_ = 0;
    TestSet::TestSet((TestSet *)&currentSet);
    std::__cxx11::
    list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
    ::push_back((list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
                 *)local_58,(TestSet *)&currentSet);
    TestSet::~TestSet((TestSet *)&currentSet);
    i_1._M_node = (_Base_ptr)
                  std::__cxx11::
                  list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
                  ::back((list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
                          *)local_58);
    local_148._M_node =
         (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::begin(local_108);
    while( true ) {
      dependencies = (TestSet *)std::set<int,_std::less<int>,_std::allocator<int>_>::end(local_108);
      bVar1 = std::operator!=(&local_148,(_Self *)&dependencies);
      if (!bVar1) break;
      piVar5 = std::_Rb_tree_const_iterator<int>::operator*(&local_148);
      psVar4 = &std::
                map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                ::operator[](&(this->Tests).
                              super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                             ,piVar5)->super_set<int,_std::less<int>,_std::allocator<int>_>;
      this_00 = i_1;
      iVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(psVar4);
      i_2._M_node = (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::end(psVar4);
      std::set<int,std::less<int>,std::allocator<int>>::insert<std::_Rb_tree_const_iterator<int>>
                ((set<int,std::less<int>,std::allocator<int>> *)this_00._M_node,
                 (_Rb_tree_const_iterator<int>)iVar6._M_node,
                 (_Rb_tree_const_iterator<int>)i_2._M_node);
      std::_Rb_tree_const_iterator<int>::operator++(&local_148);
    }
    local_170 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(i_1._M_node);
    while( true ) {
      i_3.current._M_node =
           (_List_iterator<cmCTestMultiProcessHandler::TestSet>)
           std::set<int,_std::less<int>,_std::allocator<int>_>::end
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)i_1._M_node);
      bVar1 = std::operator!=(&stack0xfffffffffffffe90,(_Self *)&i_3);
      psVar4 = local_108;
      if (!bVar1) break;
      piVar5 = std::_Rb_tree_const_iterator<int>::operator*(&stack0xfffffffffffffe90);
      std::set<int,_std::less<int>,_std::allocator<int>_>::erase(psVar4,piVar5);
      std::_Rb_tree_const_iterator<int>::operator++(&stack0xfffffffffffffe90);
    }
  }
  std::__cxx11::
  list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>::
  pop_back((list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
            *)local_58);
  std::__cxx11::
  list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>::
  rbegin((list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
          *)&stack0xfffffffffffffe80);
  while( true ) {
    std::__cxx11::
    list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
    ::rend((list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
            *)&currentSet_1);
    bVar1 = std::operator!=((reverse_iterator<std::_List_iterator<cmCTestMultiProcessHandler::TestSet>_>
                             *)&stack0xfffffffffffffe80,
                            (reverse_iterator<std::_List_iterator<cmCTestMultiProcessHandler::TestSet>_>
                             *)&currentSet_1);
    if (!bVar1) break;
    psVar4 = &std::reverse_iterator<std::_List_iterator<cmCTestMultiProcessHandler::TestSet>_>::
              operator*((reverse_iterator<std::_List_iterator<cmCTestMultiProcessHandler::TestSet>_>
                         *)&stack0xfffffffffffffe80)->
              super_set<int,_std::less<int>,_std::allocator<int>_>;
    TestComparator::TestComparator
              ((TestComparator *)
               &sortedCopy.super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage,this);
    TestList::TestList((TestList *)local_1b0);
    local_1c0._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)local_1b0);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_1b8,
               &local_1c0);
    iVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(psVar4);
    __last = std::set<int,_std::less<int>,_std::allocator<int>_>::end(psVar4);
    std::vector<int,std::allocator<int>>::insert<std::_Rb_tree_const_iterator<int>,void>
              ((vector<int,std::allocator<int>> *)local_1b0,local_1b8,
               (_Rb_tree_const_iterator<int>)iVar6._M_node,
               (_Rb_tree_const_iterator<int>)__last._M_node);
    __first = std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_1b0);
    __last_00 = std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)local_1b0);
    j._M_current = sortedCopy.super_vector<int,_std::allocator<int>_>.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_end_of_storage;
    std::
    stable_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,TestComparator>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first._M_current
               ,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                __last_00._M_current,(TestComparator *)&j);
    TestComparator::~TestComparator((TestComparator *)&j);
    local_200._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)local_1b0);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_1f8,
               &local_200);
    while( true ) {
      local_208._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::end
                            ((vector<int,_std::allocator<int>_> *)local_1b0);
      bVar1 = __gnu_cxx::operator!=(&local_1f8,&local_208);
      if (!bVar1) break;
      piVar7 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_1f8);
      local_210._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::find
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)
                      &priorityStack.
                       super__List_base<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
                       ._M_impl._M_node._M_size,piVar7);
      local_218._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::end
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)
                      &priorityStack.
                       super__List_base<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
                       ._M_impl._M_node._M_size);
      bVar1 = std::operator==(&local_210,&local_218);
      if (bVar1) {
        piVar7 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                 ::operator*(&local_1f8);
        std::vector<int,_std::allocator<int>_>::push_back
                  (&(this->SortedTests).super_vector<int,_std::allocator<int>_>,piVar7);
        piVar7 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                 ::operator*(&local_1f8);
        std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                  ((set<int,_std::less<int>,_std::allocator<int>_> *)
                   &priorityStack.
                    super__List_base<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
                    ._M_impl._M_node._M_size,piVar7);
      }
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_1f8);
    }
    TestList::~TestList((TestList *)local_1b0);
    TestComparator::~TestComparator
              ((TestComparator *)
               &sortedCopy.super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
    std::reverse_iterator<std::_List_iterator<cmCTestMultiProcessHandler::TestSet>_>::operator++
              ((reverse_iterator<std::_List_iterator<cmCTestMultiProcessHandler::TestSet>_> *)
               &stack0xfffffffffffffe80);
  }
  std::__cxx11::
  list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>::
  ~list((list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
         *)local_58);
  TestSet::~TestSet((TestSet *)
                    &priorityStack.
                     super__List_base<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
                     ._M_impl._M_node._M_size);
  return;
}

Assistant:

void cmCTestMultiProcessHandler::CreateParallelTestCostList()
{
  TestSet alreadySortedTests;

  std::list<TestSet> priorityStack;
  priorityStack.push_back(TestSet());
  TestSet& topLevel = priorityStack.back();

  // In parallel test runs add previously failed tests to the front
  // of the cost list and queue other tests for further sorting
  for (TestMap::const_iterator i = this->Tests.begin(); i != this->Tests.end();
       ++i) {
    if (std::find(this->LastTestsFailed.begin(), this->LastTestsFailed.end(),
                  this->Properties[i->first]->Name) !=
        this->LastTestsFailed.end()) {
      // If the test failed last time, it should be run first.
      this->SortedTests.push_back(i->first);
      alreadySortedTests.insert(i->first);
    } else {
      topLevel.insert(i->first);
    }
  }

  // In parallel test runs repeatedly move dependencies of the tests on
  // the current dependency level to the next level until no
  // further dependencies exist.
  while (!priorityStack.back().empty()) {
    TestSet& previousSet = priorityStack.back();
    priorityStack.push_back(TestSet());
    TestSet& currentSet = priorityStack.back();

    for (TestSet::const_iterator i = previousSet.begin();
         i != previousSet.end(); ++i) {
      TestSet const& dependencies = this->Tests[*i];
      currentSet.insert(dependencies.begin(), dependencies.end());
    }

    for (TestSet::const_iterator i = currentSet.begin(); i != currentSet.end();
         ++i) {
      previousSet.erase(*i);
    }
  }

  // Remove the empty dependency level
  priorityStack.pop_back();

  // Reverse iterate over the different dependency levels (deepest first).
  // Sort tests within each level by COST and append them to the cost list.
  for (std::list<TestSet>::reverse_iterator i = priorityStack.rbegin();
       i != priorityStack.rend(); ++i) {
    TestSet const& currentSet = *i;
    TestComparator comp(this);

    TestList sortedCopy;

    sortedCopy.insert(sortedCopy.end(), currentSet.begin(), currentSet.end());

    std::stable_sort(sortedCopy.begin(), sortedCopy.end(), comp);

    for (TestList::const_iterator j = sortedCopy.begin();
         j != sortedCopy.end(); ++j) {
      if (alreadySortedTests.find(*j) == alreadySortedTests.end()) {
        this->SortedTests.push_back(*j);
        alreadySortedTests.insert(*j);
      }
    }
  }
}